

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O3

void curses_pause(nh_pause_reason reason)

{
  doupdate();
  if ((reason == P_MESSAGE) && (msgwin != (WINDOW *)0x0)) {
    pause_messages();
    return;
  }
  if (mapwin != (WINDOW *)0x0) {
    get_map_key(L'\0');
    return;
  }
  return;
}

Assistant:

void curses_pause(enum nh_pause_reason reason)
{
    doupdate();
    if (reason == P_MESSAGE && msgwin != NULL)
	pause_messages();
    else if (mapwin != NULL)
	/* P_MAP: pause to show the result of detection or similar */
	get_map_key(FALSE);
}